

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::definition::definition
          (definition *this,not_null<context_*> ctxt,not_null<container_*> definitions,
          not_null<const_string_mapping_*> names,fragment_index_pointer *fragments)

{
  fragment_index_pointer *fragments_local;
  definition *this_local;
  not_null<const_string_mapping_*> names_local;
  not_null<container_*> definitions_local;
  not_null<context_*> ctxt_local;
  
  rule::rule(&this->super_rule,ctxt);
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__definition_002388e8;
  (this->definitions_).ptr_ = definitions.ptr_;
  (this->names_).ptr_ = names.ptr_;
  std::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::shared_ptr(&this->fragments_,fragments);
  std::bitset<4UL>::bitset(&this->seen_);
  std::__cxx11::string::string((string *)&this->digest_);
  this->name_ = 0;
  std::__cxx11::string::string((string *)&this->linkage_);
  std::__cxx11::string::string((string *)&this->visibility_);
  return;
}

Assistant:

definition::definition (not_null<context *> const ctxt,
                                    not_null<container *> const definitions,
                                    not_null<string_mapping const *> const names,
                                    fragment_index_pointer const & fragments)
                    : rule (ctxt)
                    , definitions_{definitions}
                    , names_{names}
                    , fragments_{fragments} {}